

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall HighsLpRelaxation::removeObsoleteRows(HighsLpRelaxation *this,bool notifyPool)

{
  int ndelcuts;
  size_type sVar1;
  size_type __new_size;
  long lVar2;
  vector<int,_std::allocator<int>_> deletemask;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  __new_size = (size_type)(this->lpsolver).model_.lp_.num_row_;
  sVar1 = (size_type)this->mipsolver->model_->num_row_;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = sVar1 * 3 + 1;
  ndelcuts = 0;
  for (; __new_size != sVar1; sVar1 = sVar1 + 1) {
    if ((this->lpsolver).basis_.row_status.
        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[sVar1] == kBasic) {
      if (ndelcuts == 0) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&local_48,__new_size);
      }
      ndelcuts = ndelcuts + 1;
      local_48._M_impl.super__Vector_impl_data._M_start[sVar1] = 1;
      if (notifyPool) {
        HighsCutPool::lpCutRemoved
                  (&((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                   (&((this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_start)->origin)[lVar2]);
      }
    }
    lVar2 = lVar2 + 3;
  }
  removeCuts(this,ndelcuts,(vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void HighsLpRelaxation::removeObsoleteRows(bool notifyPool) {
  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      if (ndelcuts == 0) deletemask.resize(nlprows);
      ++ndelcuts;
      deletemask[i] = 1;
      if (notifyPool) mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
    }
  }

  removeCuts(ndelcuts, deletemask);
}